

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

gravity_function_t *
gravity_function_new
          (gravity_vm *vm,char *identifier,uint16_t nparams,uint16_t nlocals,uint16_t ntemps,
          void *code)

{
  gravity_function_t *obj;
  char *local_38;
  gravity_function_t *f;
  void *code_local;
  uint16_t ntemps_local;
  uint16_t nlocals_local;
  uint16_t nparams_local;
  char *identifier_local;
  gravity_vm *vm_local;
  
  obj = (gravity_function_t *)gravity_calloc((gravity_vm *)0x0,1,0xb8);
  if (obj != (gravity_function_t *)0x0) {
    obj->isa = gravity_class_function;
    if (identifier == (char *)0x0) {
      local_38 = (char *)0x0;
    }
    else {
      local_38 = string_dup(identifier);
    }
    obj->identifier = local_38;
    obj->tag = 0;
    obj->nparams = nparams;
    obj->nlocals = nlocals;
    obj->ntemps = ntemps;
    obj->nupvalues = 0;
    if (code != (void *)0x0) {
      (obj->field_9).field_0.useargs = false;
      (obj->field_9).field_0.bytecode = (uint32_t *)code;
      (obj->field_9).field_0.cpool.m = 0;
      (obj->field_9).field_0.cpool.n = 0;
      (obj->field_9).field_0.cpool.p = (gravity_value_t *)0x0;
      (obj->field_9).field_0.pvalue.m = 0;
      (obj->field_9).field_0.pvalue.n = 0;
      (obj->field_9).field_0.pvalue.p = (gravity_value_t *)0x0;
      (obj->field_9).field_0.pname.m = 0;
      (obj->field_9).field_0.pname.n = 0;
      (obj->field_9).field_0.pname.p = (gravity_value_t *)0x0;
    }
    if (vm != (gravity_vm *)0x0) {
      gravity_vm_transfer(vm,(gravity_object_t *)obj);
    }
    return obj;
  }
  __assert_fail("f",
                "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/shared/gravity_value.c"
                ,0x1de,
                "gravity_function_t *gravity_function_new(gravity_vm *, const char *, uint16_t, uint16_t, uint16_t, void *)"
               );
}

Assistant:

gravity_function_t *gravity_function_new (gravity_vm *vm, const char *identifier, uint16_t nparams, uint16_t nlocals, uint16_t ntemps, void *code) {
    gravity_function_t *f = (gravity_function_t *)mem_alloc(NULL, sizeof(gravity_function_t));
    assert(f);

    f->isa = gravity_class_function;
    f->identifier = (identifier) ? string_dup(identifier) : NULL;
    f->tag = EXEC_TYPE_NATIVE;
    f->nparams = nparams;
    f->nlocals = nlocals;
    f->ntemps = ntemps;
    f->nupvalues = 0;

    // only available in EXEC_TYPE_NATIVE case
    // code is != NULL when EXEC_TYPE_NATIVE
    if (code != NULL) {
        f->useargs = false;
        f->bytecode = (uint32_t *)code;
        marray_init(f->cpool);
        marray_init(f->pvalue);
        marray_init(f->pname);
    }

    if (vm) gravity_vm_transfer(vm, (gravity_object_t*)f);
    return f;
}